

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsoncbor.cpp
# Opt level: O0

QCborValue * QCborValue::fromVariant(QVariant *variant)

{
  bool bVar1;
  int iVar2;
  qlonglong qVar3;
  qulonglong qVar4;
  ulong uVar5;
  QCborValue *in_RDI;
  long in_FS_OFFSET;
  QString string;
  QJsonDocument doc;
  undefined4 in_stack_fffffffffffffda8;
  int in_stack_fffffffffffffdac;
  QCborValue *in_stack_fffffffffffffdb0;
  QVariant *in_stack_fffffffffffffdb8;
  QString *s;
  undefined7 in_stack_fffffffffffffdc0;
  undefined1 in_stack_fffffffffffffdc7;
  QJsonDocument *in_stack_fffffffffffffdc8;
  QUuid *in_stack_fffffffffffffdd0;
  QCborValue *in_stack_fffffffffffffdd8;
  QCborValue *in_stack_fffffffffffffde0;
  QCborValue *in_stack_fffffffffffffde8;
  undefined7 in_stack_fffffffffffffdf0;
  undefined1 in_stack_fffffffffffffdf7;
  QVariantList *in_stack_fffffffffffffdf8;
  QVariantMap *in_stack_fffffffffffffe20;
  QString local_158 [3];
  undefined1 *local_108;
  QMetaTypeInterface *local_38;
  QUuid local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = (QMetaTypeInterface *)
             ::QVariant::metaType
                       ((QVariant *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
  iVar2 = QMetaType::id((QMetaType *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac);
  switch(iVar2) {
  case 0:
    QCborValue((QCborValue *)in_RDI);
    break;
  case 1:
    bVar1 = ::QVariant::toBool((QVariant *)
                               CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0));
    QCborValue((QCborValue *)in_RDI,bVar1);
    break;
  case 2:
  case 3:
  case 4:
  case 0x20:
  case 0x21:
  case 0x24:
    qVar3 = ::QVariant::toLongLong
                      ((QVariant *)in_stack_fffffffffffffdb0,
                       (bool *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
    QCborValue((QCborValue *)in_RDI,qVar3);
    break;
  case 5:
  case 0x23:
    qVar4 = ::QVariant::toULongLong
                      ((QVariant *)in_stack_fffffffffffffdb0,
                       (bool *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
    uVar5 = std::numeric_limits<long_long>::max();
    if (qVar4 <= uVar5) {
      qVar3 = ::QVariant::toLongLong
                        ((QVariant *)in_stack_fffffffffffffdb0,
                         (bool *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
      QCborValue((QCborValue *)in_RDI,qVar3);
      break;
    }
  case 6:
  case 0x26:
  case 0x3f:
    ::QVariant::toDouble
              ((QVariant *)in_stack_fffffffffffffdb0,
               (bool *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
    QCborValue((QCborValue *)0x48b646,
               (double)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
    break;
  default:
    bVar1 = ::QVariant::isNull(in_stack_fffffffffffffdb8);
    if (bVar1) {
      QCborValue((QCborValue *)in_RDI,(nullptr_t)0x0);
    }
    else {
      local_158[0].d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_158[0].d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      local_158[0].d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      s = local_158;
      ::QVariant::toString
                ((QVariant *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
      bVar1 = QString::isNull((QString *)0x48c088);
      if (bVar1) {
        QCborValue((QCborValue *)in_RDI);
      }
      else {
        QCborValue((QCborValue *)CONCAT17(bVar1,in_stack_fffffffffffffdc0),s);
      }
      QString::~QString((QString *)0x48c10a);
    }
    break;
  case 8:
    ::QVariant::toMap((QVariant *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
    QCborMap::fromVariantMap(in_stack_fffffffffffffe20);
    QCborValue(in_stack_fffffffffffffdb0,
               (QCborMap *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
    QCborMap::~QCborMap((QCborMap *)0x48ba10);
    QMap<QString,_QVariant>::~QMap((QMap<QString,_QVariant> *)0x48ba1d);
    break;
  case 9:
    ::QVariant::toList((QVariant *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
    QCborArray::fromVariantList(in_stack_fffffffffffffdf8);
    QCborValue(in_stack_fffffffffffffdb0,
               (QCborArray *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
    QCborArray::~QCborArray((QCborArray *)0x48b955);
    QList<QVariant>::~QList((QList<QVariant> *)0x48b962);
    break;
  case 10:
    ::QVariant::toString((QVariant *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
    QCborValue((QCborValue *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0),
               (QString *)in_stack_fffffffffffffdb8);
    QString::~QString((QString *)0x48b68c);
    break;
  case 0xb:
    ::QVariant::toStringList
              ((QVariant *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
    QCborArray::fromStringList((QStringList *)in_stack_fffffffffffffdf8);
    QCborValue(in_stack_fffffffffffffdb0,
               (QCborArray *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
    QCborArray::~QCborArray((QCborArray *)0x48b713);
    QList<QString>::~QList((QList<QString> *)0x48b720);
    break;
  case 0xc:
    ::QVariant::toByteArray
              ((QVariant *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
    QCborValue(in_stack_fffffffffffffde0,(QByteArray *)in_stack_fffffffffffffdd8);
    QByteArray::~QByteArray((QByteArray *)0x48b7b7);
    break;
  case 0x10:
    ::QVariant::toDateTime
              ((QVariant *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
    QCborValue(in_stack_fffffffffffffde0,(QDateTime *)in_stack_fffffffffffffdd8);
    QDateTime::~QDateTime((QDateTime *)0x48b827);
    break;
  case 0x11:
    ::QVariant::toUrl((QVariant *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
    QCborValue(in_stack_fffffffffffffde8,(QUrl *)in_stack_fffffffffffffde0);
    QUrl::~QUrl((QUrl *)in_stack_fffffffffffffdb0);
    break;
  case 0x1c:
    ::QVariant::toHash((QVariant *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
    QCborMap::fromVariantHash
              ((QVariantHash *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0));
    QCborValue(in_stack_fffffffffffffdb0,
               (QCborMap *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
    QCborMap::~QCborMap((QCborMap *)0x48bacb);
    QHash<QString,_QVariant>::~QHash((QHash<QString,_QVariant> *)in_stack_fffffffffffffdb0);
    break;
  case 0x1e:
    local_18 = ::QVariant::toUuid(in_stack_fffffffffffffdb8);
    QCborValue(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
    break;
  case 0x2c:
    ::QVariant::toRegularExpression
              ((QVariant *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
    QCborValue(in_stack_fffffffffffffdd8,(QRegularExpression *)in_stack_fffffffffffffdd0);
    QRegularExpression::~QRegularExpression((QRegularExpression *)0x48bb69);
    break;
  case 0x2d:
    ::QVariant::toJsonValue
              ((QVariant *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
    fromJsonValue((QJsonValue *)in_stack_fffffffffffffdf8);
    QJsonValue::~QJsonValue((QJsonValue *)0x48bbd3);
    break;
  case 0x2e:
    ::QVariant::toJsonObject
              ((QVariant *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
    QCborMap::fromJsonObject((QJsonObject *)in_stack_fffffffffffffdd0);
    QCborValue(in_stack_fffffffffffffdb0,
               (QCborMap *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
    QCborMap::~QCborMap((QCborMap *)0x48bc54);
    QJsonObject::~QJsonObject((QJsonObject *)0x48bc61);
    break;
  case 0x2f:
    ::QVariant::toJsonArray
              ((QVariant *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
    QCborArray::fromJsonArray((QJsonArray *)in_stack_fffffffffffffdd0);
    QCborValue(in_stack_fffffffffffffdb0,
               (QCborArray *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
    QCborArray::~QCborArray((QCborArray *)0x48bcef);
    QJsonArray::~QJsonArray((QJsonArray *)0x48bcfc);
    break;
  case 0x30:
    local_108 = &DAT_aaaaaaaaaaaaaaaa;
    ::QVariant::toJsonDocument
              ((QVariant *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
    bVar1 = QJsonDocument::isArray
                      ((QJsonDocument *)
                       CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
    if (bVar1) {
      QJsonDocument::array(in_stack_fffffffffffffdc8);
      QCborArray::fromJsonArray((QJsonArray *)in_stack_fffffffffffffdd0);
      QCborValue(in_stack_fffffffffffffdb0,
                 (QCborArray *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
      QCborArray::~QCborArray((QCborArray *)0x48bdd3);
      QJsonArray::~QJsonArray((QJsonArray *)0x48bde0);
    }
    else {
      QJsonDocument::object(in_stack_fffffffffffffdc8);
      QCborMap::fromJsonObject((QJsonObject *)in_stack_fffffffffffffdd0);
      QCborValue(in_stack_fffffffffffffdb0,
                 (QCborMap *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
      QCborMap::~QCborMap((QCborMap *)0x48be96);
      QJsonObject::~QJsonObject((QJsonObject *)0x48bea3);
    }
    QJsonDocument::~QJsonDocument((QJsonDocument *)0x48bef1);
    break;
  case 0x33:
    QCborValue((QCborValue *)in_RDI,(nullptr_t)0x0);
    break;
  case 0x34:
    qvariant_cast<QCborSimpleType>((QVariant *)in_stack_fffffffffffffdb0);
    QCborValue(in_stack_fffffffffffffdb0,(QCborSimpleType)((uint)in_stack_fffffffffffffdac >> 0x18))
    ;
    break;
  case 0x35:
    qvariant_cast<QCborValue>((QVariant *)in_stack_fffffffffffffde8);
    break;
  case 0x36:
    qvariant_cast<QCborArray>((QVariant *)in_stack_fffffffffffffde8);
    QCborValue(in_stack_fffffffffffffdb0,
               (QCborArray *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
    QCborArray::~QCborArray((QCborArray *)0x48bf5d);
    break;
  case 0x37:
    qvariant_cast<QCborMap>((QVariant *)in_stack_fffffffffffffde8);
    QCborValue(in_stack_fffffffffffffdb0,
               (QCborMap *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
    QCborMap::~QCborMap((QCborMap *)0x48bfc7);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QCborValue QCborValue::fromVariant(const QVariant &variant)
{
    switch (variant.metaType().id()) {
    case QMetaType::UnknownType:
        return {};
    case QMetaType::Nullptr:
        return nullptr;
    case QMetaType::Bool:
        return variant.toBool();
    case QMetaType::Short:
    case QMetaType::UShort:
    case QMetaType::Int:
    case QMetaType::LongLong:
    case QMetaType::Long:
    case QMetaType::UInt:
        return variant.toLongLong();
    case QMetaType::ULong:
    case QMetaType::ULongLong:
        if (variant.toULongLong() <= static_cast<uint64_t>(std::numeric_limits<qint64>::max()))
            return variant.toLongLong();
        Q_FALLTHROUGH();
    case QMetaType::Float16:
    case QMetaType::Float:
    case QMetaType::Double:
        return variant.toDouble();
    case QMetaType::QString:
        return variant.toString();
    case QMetaType::QStringList:
        return QCborArray::fromStringList(variant.toStringList());
    case QMetaType::QByteArray:
        return variant.toByteArray();
#if QT_CONFIG(datestring)
    case QMetaType::QDateTime:
        return QCborValue(variant.toDateTime());
#endif
#ifndef QT_BOOTSTRAPPED
    case QMetaType::QUrl:
        return QCborValue(variant.toUrl());
    case QMetaType::QUuid:
        return QCborValue(variant.toUuid());
#endif
    case QMetaType::QVariantList:
        return QCborArray::fromVariantList(variant.toList());
    case QMetaType::QVariantMap:
        return QCborMap::fromVariantMap(variant.toMap());
    case QMetaType::QVariantHash:
        return QCborMap::fromVariantHash(variant.toHash());
#ifndef QT_BOOTSTRAPPED
#if QT_CONFIG(regularexpression)
    case QMetaType::QRegularExpression:
        return QCborValue(variant.toRegularExpression());
#endif
    case QMetaType::QJsonValue:
        return fromJsonValue(variant.toJsonValue());
    case QMetaType::QJsonObject:
        return QCborMap::fromJsonObject(variant.toJsonObject());
    case QMetaType::QJsonArray:
        return QCborArray::fromJsonArray(variant.toJsonArray());
    case QMetaType::QJsonDocument: {
        QJsonDocument doc = variant.toJsonDocument();
        if (doc.isArray())
            return QCborArray::fromJsonArray(doc.array());
        return QCborMap::fromJsonObject(doc.object());
    }
    case QMetaType::QCborValue:
        return qvariant_cast<QCborValue>(variant);
    case QMetaType::QCborArray:
        return qvariant_cast<QCborArray>(variant);
    case QMetaType::QCborMap:
        return qvariant_cast<QCborMap>(variant);
    case QMetaType::QCborSimpleType:
        return qvariant_cast<QCborSimpleType>(variant);
#endif
    default:
        break;
    }

    if (variant.isNull())
        return QCborValue(nullptr);

    QString string = variant.toString();
    if (string.isNull())
        return QCborValue();        // undefined
    return string;
}